

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::adjustForCapitalizationContext
          (RuleBasedNumberFormat *this,int32_t startPos,UnicodeString *currentResult,
          UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  UChar32 c;
  UChar32 ch;
  UDisplayContext capitalizationContext;
  UErrorCode *status_local;
  UnicodeString *currentResult_local;
  int32_t startPos_local;
  RuleBasedNumberFormat *this_local;
  
  iVar2 = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x21])
                    (this,1,status);
  if (((iVar2 != 0x100) && (startPos == 0)) &&
     (iVar3 = UnicodeString::length(currentResult), 0 < iVar3)) {
    c = UnicodeString::char32At(currentResult,0);
    UVar1 = u_islower_63(c);
    if ((((UVar1 != '\0') && (UVar1 = ::U_SUCCESS(*status), UVar1 != '\0')) &&
        (this->capitalizationBrkIter != (BreakIterator *)0x0)) &&
       (((iVar2 == 0x102 || ((iVar2 == 0x103 && (this->capitalizationForUIListMenu != '\0')))) ||
        ((iVar2 == 0x104 && (this->capitalizationForStandAlone != '\0')))))) {
      UnicodeString::toTitle(currentResult,this->capitalizationBrkIter,&this->locale,0x300);
    }
  }
  return currentResult;
}

Assistant:

UnicodeString&
RuleBasedNumberFormat::adjustForCapitalizationContext(int32_t startPos,
                                                      UnicodeString& currentResult,
                                                      UErrorCode& status) const
{
#if !UCONFIG_NO_BREAK_ITERATION
    UDisplayContext capitalizationContext = getContext(UDISPCTX_TYPE_CAPITALIZATION, status);
    if (capitalizationContext != UDISPCTX_CAPITALIZATION_NONE && startPos == 0 && currentResult.length() > 0) {
        // capitalize currentResult according to context
        UChar32 ch = currentResult.char32At(0);
        if (u_islower(ch) && U_SUCCESS(status) && capitalizationBrkIter != NULL &&
              ( capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE ||
                (capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU && capitalizationForUIListMenu) ||
                (capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_STANDALONE && capitalizationForStandAlone)) ) {
            // titlecase first word of currentResult, here use sentence iterator unlike current implementations
            // in LocaleDisplayNamesImpl::adjustForUsageAndContext and RelativeDateFormat::format
            currentResult.toTitle(capitalizationBrkIter, locale, U_TITLECASE_NO_LOWERCASE | U_TITLECASE_NO_BREAK_ADJUSTMENT);
        }
    }
#endif
    return currentResult;
}